

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reversed_tests.cpp
# Opt level: O0

void __thiscall omp_reversed_const_move_case_Test::TestBody(omp_reversed_const_move_case_Test *this)

{
  allocator<int> *this_00;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  bool bVar1;
  char *message;
  vector<int,_std::allocator<int>_> *container;
  char *in_R9;
  string local_138;
  AssertHelper local_118;
  Message local_110;
  int *local_108;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_100;
  undefined1 local_f8 [23];
  bool local_e1;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_;
  int local_c8 [6];
  iterator local_b0;
  size_type local_a8;
  undefined1 local_a0 [8];
  vector<int,_std::allocator<int>_> expecting;
  reversed_container_adapter<const_std::vector<int,_std::allocator<int>_>_> reversed_values;
  allocator<int> local_59;
  int local_58 [8];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> values;
  omp_reversed_const_move_case_Test *this_local;
  
  local_58[0] = 1;
  local_58[1] = 4;
  local_58[2] = 3;
  local_58[3] = 2;
  local_58[4] = 5;
  local_38 = local_58;
  local_30 = 5;
  values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  std::allocator<int>::allocator(&local_59);
  __l_00._M_len = local_30;
  __l_00._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,__l_00,&local_59);
  std::allocator<int>::~allocator(&local_59);
  omp::reversed<std::vector<int,std::allocator<int>>const>
            ((reversed_container_adapter<const_std::vector<int,_std::allocator<int>_>_> *)
             &expecting.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(omp *)local_28,container);
  local_c8[0] = 5;
  local_c8[1] = 2;
  local_c8[2] = 3;
  local_c8[3] = 4;
  local_c8[4] = 1;
  local_b0 = local_c8;
  local_a8 = 5;
  this_00 = (allocator<int> *)
            ((long)&gtest_ar_.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 7);
  std::allocator<int>::allocator(this_00);
  __l._M_len = local_a8;
  __l._M_array = local_b0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_a0,__l,this_00);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  std::cbegin<omp::details::reversed_container_adapter<std::vector<int,std::allocator<int>>const>>
            ((reversed_container_adapter<const_std::vector<int,_std::allocator<int>_>_> *)
             (local_f8 + 8));
  std::cend<omp::details::reversed_container_adapter<std::vector<int,std::allocator<int>>const>>
            ((reversed_container_adapter<const_std::vector<int,_std::allocator<int>_>_> *)local_f8);
  local_100._M_current =
       (int *)std::cbegin<std::vector<int,std::allocator<int>>>
                        ((vector<int,_std::allocator<int>_> *)local_a0);
  local_108 = (int *)std::cend<std::vector<int,std::allocator<int>>>
                               ((vector<int,_std::allocator<int>_> *)local_a0);
  local_e1 = std::
             equal<std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                       ((reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                         *)(local_f8 + 8),
                        (reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                         *)local_f8,local_100,
                        (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                        local_108);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_e0,&local_e1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_138,(internal *)local_e0,
               (AssertionResult *)
               "std::equal(std::cbegin(reversed_values), std::cend(reversed_values), std::cbegin(expecting), std::cend(expecting))"
               ,"false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CallOfCrutches[P]omp_utils/tests/omp/utils/reversed_tests.cpp"
               ,0x35,message);
    testing::internal::AssertHelper::operator=(&local_118,&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_a0);
  omp::details::reversed_container_adapter<const_std::vector<int,_std::allocator<int>_>_>::
  ~reversed_container_adapter
            ((reversed_container_adapter<const_std::vector<int,_std::allocator<int>_>_> *)
             &expecting.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return;
}

Assistant:

TEST(omp_reversed, const_move_case) {
  const std::vector values = {1, 4, 3, 2, 5};

  auto reversed_values = omp::reversed(std::move(values));

  std::vector expecting = {5, 2, 3, 4, 1};

  ASSERT_TRUE(std::equal(std::cbegin(reversed_values),
                         std::cend(reversed_values), std::cbegin(expecting),
                         std::cend(expecting)));
}